

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::AnyMetadata::InternalIs(AnyMetadata *this,StringPiece type_name)

{
  string *psVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  bool bVar8;
  undefined1 *local_68;
  string *local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  string *local_40;
  undefined1 local_38 [16];
  
  uVar6 = type_name.length_;
  pcVar7 = type_name.ptr_;
  psVar1 = this->type_url_->ptr_;
  sVar2 = psVar1->_M_string_length;
  if ((long)uVar6 < (long)sVar2) {
    pcVar3 = (psVar1->_M_dataplus)._M_p;
    if (pcVar3[~uVar6 + sVar2] != '/') goto LAB_002bb50d;
    local_48 = local_38;
    if (pcVar3 == (pointer)0x0) {
      local_40 = (string *)0x0;
      local_38[0] = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48);
    }
    local_68 = local_58;
    if (pcVar7 == (char *)0x0) {
      local_60 = (string *)0x0;
      local_58[0] = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,pcVar7,pcVar7 + uVar6);
    }
    bVar4 = true;
    bVar8 = true;
    if (local_60 <= local_40) {
      iVar5 = std::__cxx11::string::compare
                        ((ulong)&local_48,(long)local_40 - (long)local_60,local_60);
      bVar8 = iVar5 == 0;
      goto LAB_002bb511;
    }
  }
  else {
LAB_002bb50d:
    bVar8 = false;
  }
  bVar4 = bVar8;
  bVar8 = false;
LAB_002bb511:
  if (bVar4) {
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
  }
  return bVar8;
}

Assistant:

bool AnyMetadata::InternalIs(StringPiece type_name) const {
  StringPiece type_url = Get(type_url_);
  return type_url.size() >= type_name.size() + 1 &&
         type_url[type_url.size() - type_name.size() - 1] == '/' &&
         HasSuffixString(type_url, type_name);
}